

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

bool __thiscall roaring::Roaring64Map::isEmpty(Roaring64Map *this)

{
  _Rb_tree_node_base *p_Var1;
  _Bool _Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var1 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  while (((_Rb_tree_header *)p_Var1 != p_Var3 &&
         (_Var2 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var1[1]._M_parent), _Var2))) {
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  return (_Rb_tree_header *)p_Var1 == p_Var3;
}

Assistant:

bool isEmpty() const {
        return std::all_of(
            roarings.cbegin(), roarings.cend(),
            [](const std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.isEmpty();
            });
    }